

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cx_string.hpp
# Opt level: O3

cx_string<58UL> * __thiscall
mserialize::cx_strcat<9ul,2ul,24ul,2ul,12ul,3ul,1ul,3ul,1ul,1ul>
          (cx_string<58UL> *__return_storage_ptr__,mserialize *this,cx_string<9UL> *strings,
          cx_string<2UL> *strings_1,cx_string<24UL> *strings_2,cx_string<2UL> *strings_3,
          cx_string<12UL> *strings_4,cx_string<3UL> *strings_5,cx_string<1UL> *strings_6,
          cx_string<3UL> *strings_7,cx_string<1UL> *strings_8,cx_string<1UL> *strings_9)

{
  long lVar1;
  ulong uVar2;
  undefined8 *puVar3;
  char buffer [59];
  ulong auStack_108 [12];
  long lStack_a8;
  mserialize *local_a0;
  cx_string<9UL> *local_98;
  cx_string<2UL> *local_90;
  cx_string<24UL> *local_88;
  cx_string<2UL> *local_80;
  cx_string<12UL> *local_78;
  cx_string<3UL> *pcStack_70;
  cx_string<1UL> *local_68;
  cx_string<3UL> *pcStack_60;
  cx_string<1UL> *local_58;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 uStack_28;
  undefined2 uStack_20;
  undefined1 uStack_1e;
  undefined5 local_1d;
  undefined2 uStack_18;
  undefined1 uStack_16;
  undefined7 uStack_15;
  
  puVar3 = &local_48;
  uStack_18 = 0;
  uStack_16 = 0;
  uStack_15 = 0;
  uStack_28 = 0;
  uStack_20 = 0;
  uStack_1e = 0;
  local_1d = 0;
  local_38 = 0;
  uStack_30 = 0;
  local_48 = 0;
  uStack_40 = 0;
  local_a0 = this;
  local_98 = strings;
  local_90 = strings_1;
  local_88 = strings_2;
  local_80 = strings_3;
  local_78 = strings_4;
  pcStack_70 = strings_5;
  local_68 = strings_6;
  pcStack_60 = strings_7;
  local_58 = strings_8;
  auStack_108[1] = 9;
  auStack_108[2] = 2;
  auStack_108[3] = 0x18;
  auStack_108[4] = 2;
  auStack_108[5] = 0xc;
  auStack_108[6] = 3;
  lVar1 = 1;
  auStack_108[7] = 1;
  auStack_108[8] = 3;
  auStack_108[9] = 1;
  auStack_108[10] = 1;
  do {
    if (auStack_108[lVar1] != 0) {
      uVar2 = 0;
      do {
        *(undefined1 *)((long)puVar3 + uVar2) = *(undefined1 *)((&lStack_a8)[lVar1] + uVar2);
        uVar2 = uVar2 + 1;
      } while (uVar2 < auStack_108[lVar1]);
      puVar3 = (undefined8 *)((long)puVar3 + uVar2);
    }
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0xb);
  __return_storage_ptr__->_data[0x3a] = '\0';
  *(undefined8 *)__return_storage_ptr__->_data = local_48;
  *(undefined8 *)(__return_storage_ptr__->_data + 8) = uStack_40;
  *(undefined8 *)(__return_storage_ptr__->_data + 0x10) = local_38;
  *(undefined8 *)(__return_storage_ptr__->_data + 0x18) = uStack_30;
  *(undefined8 *)(__return_storage_ptr__->_data + 0x20) = uStack_28;
  *(ulong *)(__return_storage_ptr__->_data + 0x28) =
       CONCAT53(local_1d,CONCAT12(uStack_1e,uStack_20));
  *(ulong *)(__return_storage_ptr__->_data + 0x2a) =
       CONCAT26(uStack_18,CONCAT51(local_1d,uStack_1e));
  *(ulong *)(__return_storage_ptr__->_data + 0x32) = CONCAT71(uStack_15,uStack_16);
  return __return_storage_ptr__;
}

Assistant:

constexpr auto cx_strcat(const cx_string<N>&&... strings)
{
  char buffer[detail::sum<N...>()+1] = {0};
  const char* data[] = {"", strings.data()...};
  const std::size_t size[] = {0, strings.size()...};

  char* out = buffer;
  for (std::size_t i = 1; i <= sizeof...(N); ++i)
  {
    for (std::size_t s = 0; s < size[i]; ++s) { *out++ = data[i][s]; } // NOLINT
  }

  return cx_string<sizeof(buffer)-1>(buffer);
}